

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-raw-file.c
# Opt level: O0

int rops_handle_POLLIN_raw_file(lws_context_per_thread *pt,lws *wsi,pollfd *pollfd)

{
  int iVar1;
  int iVar2;
  int n;
  pollfd *pollfd_local;
  lws *wsi_local;
  lws_context_per_thread *pt_local;
  
  if ((pollfd->revents & 4U) != 0) {
    iVar1 = lws_callback_as_writeable(wsi);
    iVar2 = lws_change_pollfd(wsi,4,0);
    if (iVar2 != 0) {
      _lws_log(8,"failed at set pollfd\n");
      return 4;
    }
    if (iVar1 != 0) {
      return 6;
    }
  }
  if (((pollfd->revents & 1U) == 0) ||
     (iVar1 = user_callback_handle_rxflow
                        (wsi->protocol->callback,wsi,LWS_CALLBACK_RAW_RX_FILE,wsi->user_space,
                         (void *)0x0,0), iVar1 == 0)) {
    if (((pollfd->revents & 0x18U) == 0) || ((pollfd->revents & 1U) != 0)) {
      pt_local._4_4_ = 5;
    }
    else {
      pt_local._4_4_ = 6;
    }
  }
  else {
    _lws_log(0x10,"raw rx callback closed it\n");
    pt_local._4_4_ = 6;
  }
  return pt_local._4_4_;
}

Assistant:

static int
rops_handle_POLLIN_raw_file(struct lws_context_per_thread *pt, struct lws *wsi,
			    struct lws_pollfd *pollfd)
{
	int n;

	if (pollfd->revents & LWS_POLLOUT) {
		n = lws_callback_as_writeable(wsi);
		if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
			lwsl_info("failed at set pollfd\n");
			return LWS_HPI_RET_WSI_ALREADY_DIED;
		}
		if (n)
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
	}

	if (pollfd->revents & LWS_POLLIN) {
		if (user_callback_handle_rxflow(wsi->protocol->callback,
						wsi, LWS_CALLBACK_RAW_RX_FILE,
						wsi->user_space, NULL, 0)) {
			lwsl_debug("raw rx callback closed it\n");
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}
	}

	if (pollfd->revents & LWS_POLLHUP)
		if (!(pollfd->revents & LWS_POLLIN))
			return LWS_HPI_RET_PLEASE_CLOSE_ME;

	return LWS_HPI_RET_HANDLED;
}